

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDebug.c
# Opt level: O3

int Abc_NtkFindGivenFanin(Abc_Ntk_t *pNtk,int Step,Abc_Obj_t **ppObj,Abc_Obj_t **ppFanin)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pNode;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  pVVar4 = pNtk->vObjs;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    iVar5 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)pVVar4->pArray[lVar7];
      if ((pAVar1 != (Abc_Obj_t *)0x0) && (0 < (pAVar1->vFanins).nSize)) {
        lVar6 = 0;
        do {
          pNode = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanins).pArray[lVar6]];
          uVar2 = *(uint *)&pAVar1->field_0x14 & 0xf;
          if (uVar2 == 7) {
            iVar3 = Abc_NodeIsConst(pNode);
            if (iVar3 == 0) goto LAB_002b03e6;
          }
          else if ((uVar2 == 3) && (pNtk->vPos->nSize != 1)) {
LAB_002b03e6:
            if (iVar5 == Step) {
              *ppObj = pAVar1;
              *ppFanin = pNode;
              return 1;
            }
            iVar5 = iVar5 + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pAVar1->vFanins).nSize);
        pVVar4 = pNtk->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
  }
  return 0;
}

Assistant:

int Abc_NtkFindGivenFanin( Abc_Ntk_t * pNtk, int Step, Abc_Obj_t ** ppObj, Abc_Obj_t ** ppFanin )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( !Abc_ObjIsNode(pObj) && !Abc_ObjIsPo(pObj) )
                continue;
            if ( Abc_ObjIsPo(pObj) && Abc_NtkPoNum(pNtk) == 1 )
                continue;
            if ( Abc_ObjIsNode(pObj) && Abc_NodeIsConst(pFanin) )
                continue;
            if ( Counter++ == Step )
            {
                *ppObj   = pObj;
                *ppFanin = pFanin;
                return 1;
            }
        }
    return 0;
}